

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

byte * kj::anon_unknown_45::alignTo(byte *p,uint alignment)

{
  bool bVar1;
  uintptr_t i;
  uintptr_t mask;
  Fault local_20;
  Fault f;
  uint alignment_local;
  byte *p_local;
  
  f.exception._4_4_ = alignment;
  bVar1 = isPowerOfTwo((ulong)alignment);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int&>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena.c++"
               ,0x4c,FAILED,"isPowerOfTwo(alignment)","alignment",(uint *)((long)&f.exception + 4));
    kj::_::Debug::Fault::fatal(&local_20);
  }
  return (byte *)((ulong)(p + (f.exception._4_4_ - 1)) &
                 ((ulong)(f.exception._4_4_ - 1) ^ 0xffffffffffffffff));
}

Assistant:

inline byte* alignTo(byte* p, uint alignment) {
  // Round the pointer up to the next aligned value.

  KJ_DASSERT(isPowerOfTwo(alignment), alignment);
  uintptr_t mask = alignment - 1;
  uintptr_t i = reinterpret_cast<uintptr_t>(p);
  return reinterpret_cast<byte*>((i + mask) & ~mask);
}